

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O3

double getCost0(int i)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  char *pcVar4;
  char *c3;
  char *c5;
  char *c1;
  size_t sVar5;
  ifstream infile;
  char strAns [10000];
  char buffer [10000];
  double local_5048;
  long local_5040 [2];
  long alStack_5030 [2];
  int aiStack_5020 [50];
  long alStack_4f58 [36];
  char local_4e38;
  char local_4e37;
  char local_2728 [10000];
  
  pcVar4 = catStrStr(energyFileAddress,"tempFile/temp_");
  c3 = catStrIntStr(pcVar4,i,".pdb");
  pcVar4 = catStrStr(energyFileAddress,"/defaultFile/default");
  c5 = catStrIntStr(pcVar4,i,".sc");
  pcVar4 = databaseAddress;
  c1 = catStrStr(scoreAddress," -database ");
  pcVar4 = catStrStr(c1,pcVar4);
  pcVar4 = catStrStr(pcVar4," -s ",c3," -out:file:scorefile ",c5);
  system(pcVar4);
  std::ifstream::ifstream((ifstream *)local_5040);
  openFile(c5,(ifstream *)local_5040);
  std::ios::widen((char)(ifstream *)local_5040 + (char)*(undefined8 *)(local_5040[0] + -0x18));
  std::istream::getline((char *)local_5040,(long)local_2728,'\x10');
  lVar1 = *(long *)((long)alStack_5030 + *(long *)(local_5040[0] + -0x18));
  std::__istream_extract((istream *)local_5040,local_2728,10000);
  if (((*(int *)((long)aiStack_5020 + *(long *)(local_5040[0] + -0x18)) == 0) &&
      (lVar1 - 0x2711U < 0xffffffffffffd8f0)) &&
     (plVar2 = *(long **)((long)alStack_4f58 + *(long *)(local_5040[0] + -0x18)),
     (ulong)plVar2[3] <= (ulong)plVar2[2])) {
    iVar3 = (**(code **)(*plVar2 + 0x48))();
    if (iVar3 == -1) {
      std::ios::clear((int)&local_5048 + (int)*(undefined8 *)(local_5040[0] + -0x18) + 8);
    }
  }
  lVar1 = *(long *)((long)alStack_5030 + *(long *)(local_5040[0] + -0x18));
  std::__istream_extract((istream *)local_5040,&local_4e38,10000);
  if (((*(int *)((long)aiStack_5020 + *(long *)(local_5040[0] + -0x18)) == 0) &&
      (lVar1 - 0x2711U < 0xffffffffffffd8f0)) &&
     (plVar2 = *(long **)((long)alStack_4f58 + *(long *)(local_5040[0] + -0x18)),
     (ulong)plVar2[3] <= (ulong)plVar2[2])) {
    iVar3 = (**(code **)(*plVar2 + 0x48))();
    if (iVar3 == -1) {
      std::ios::clear((int)&local_5048 + (int)*(undefined8 *)(local_5040[0] + -0x18) + 8);
    }
  }
  if (local_4e38 != 'n') {
    sVar5 = strlen(&local_4e38);
    if (((int)sVar5 < 2) || (local_4e37 != 'n')) {
      local_5048 = atof(&local_4e38);
      goto LAB_001049ac;
    }
  }
  local_5048 = 100000000.0;
LAB_001049ac:
  std::ifstream::close();
  removeFile(c5);
  std::ifstream::~ifstream(local_5040);
  return local_5048;
}

Assistant:

double getCost0(int i) {
    //remove("/home/ws/zzZyj/data/temp1.pdb"); remove("default.sc");
    /*system("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease -database \
                   /home/ws/GL/rosetta_database/ \
                   -s /home/ws/zzZyj/data/energyFile/tempFile/temp_1.pdb \
                   -out:file:scorefile /home/ws/zzZyj/data/default0.sc");*/
    const char *temp_File = catStrIntStr(energyFileAddress, "tempFile/temp_", i, ".pdb");
    const char *defaultFile = catStrIntStr(energyFileAddress, "/defaultFile/default", i, ".sc");
    /*const char *command = catStrStr("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease \
                                            -database /home/ws/GL/rosetta_database/ -s ",
                    temp_File, " -out:file:scorefile ", defaultFile);*/
    const char *command = catStrStr(scoreAddress, " -database ", databaseAddress," -s ",
                                    temp_File, " -out:file:scorefile ", defaultFile);
    system(command);
    ifstream infile;
    openFile(defaultFile, infile);
    char buffer[10000], strAns[10000];
    double ans=0;
    infile.getline(buffer, 10000);
    infile >> buffer >> strAns;
    int len = strlen(strAns);
    if (strAns[0]=='n' || (len>=2 && strAns[1]=='n'))
        ans = INF;
    else
        ans = atof(strAns);
    infile.close();
    removeFile(defaultFile);
    return ans;
}